

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle_private.hh
# Opt level: O3

shared_ptr<QPDFObject> __thiscall
QPDF_Null::create(QPDF_Null *this,shared_ptr<QPDFObject> *parent,string_view *static_descr,
                 string *var_descr)

{
  QPDF *a_qpdf;
  pointer pcVar1;
  undefined8 *puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  shared_ptr<QPDFObject> sVar4;
  shared_ptr<QPDFObject> local_60;
  string local_50;
  
  puVar2 = (undefined8 *)operator_new(0x70);
  puVar2[1] = 0x100000001;
  *puVar2 = &PTR___Sp_counted_ptr_inplace_002eaaf8;
  *(undefined1 *)(puVar2 + 8) = 2;
  puVar2[9] = 0;
  puVar2[10] = 0;
  puVar2[0xb] = 0;
  puVar2[0xc] = 0;
  puVar2[0xd] = 0xffffffffffffffff;
  *(undefined8 **)(this + 8) = puVar2;
  *(QPDFObject **)this = (QPDFObject *)(puVar2 + 2);
  local_60.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (parent->super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  a_qpdf = (local_60.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->qpdf;
  local_60.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (parent->super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_60.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_60.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_60.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_60.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_60.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  pcVar1 = (var_descr->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + var_descr->_M_string_length);
  QPDFObject::setChildDescription
            ((QPDFObject *)(puVar2 + 2),a_qpdf,&local_60,static_descr,&local_50);
  _Var3._M_pi = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    _Var3._M_pi = extraout_RDX_00;
  }
  if (local_60.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
    _Var3._M_pi = extraout_RDX_01;
  }
  sVar4.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  sVar4.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<QPDFObject>)sVar4.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline std::shared_ptr<QPDFObject>
QPDF_Null::create(
    std::shared_ptr<QPDFObject> parent, std::string_view const& static_descr, std::string var_descr)
{
    auto n = QPDFObject::create<QPDF_Null>();
    n->setChildDescription(parent->getQPDF(), parent, static_descr, var_descr);
    return n;
}